

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convertbmp.c
# Opt level: O0

opj_image_t * bmptoimage(char *filename,opj_cparameters_t *parameters)

{
  OPJ_BOOL OVar1;
  int iVar2;
  FILE *__stream;
  OPJ_UINT8 *pData_00;
  undefined8 uVar3;
  byte local_495;
  uint local_494;
  OPJ_UINT8 has_color;
  OPJ_UINT32 stride;
  OPJ_UINT8 *pData;
  int local_480;
  OPJ_BOOL l_result;
  OPJ_UINT32 numcmpts;
  OPJ_UINT32 palette_len;
  OPJ_UINT32 i;
  OPJ_BITMAPINFOHEADER Info_h;
  OPJ_BITMAPFILEHEADER File_h;
  FILE *IN;
  opj_image_t *image;
  OPJ_UINT8 *pLUT [3];
  byte local_3b8 [8];
  OPJ_UINT8 lut_B [256];
  OPJ_UINT8 lut_G [256];
  OPJ_UINT8 lut_R [256];
  opj_image_cmptparm_t cmptparm [4];
  opj_cparameters_t *parameters_local;
  char *filename_local;
  
  local_480 = 1;
  image = (opj_image_t *)(lut_G + 0xf8);
  pLUT[0] = lut_B + 0xf8;
  pLUT[1] = local_3b8;
  __stream = fopen(filename,"rb");
  if (__stream == (FILE *)0x0) {
    fprintf(_stderr,"Failed to open %s for reading !!\n",filename);
    filename_local = (char *)0x0;
  }
  else {
    OVar1 = bmp_read_file_header((FILE *)__stream,(OPJ_BITMAPFILEHEADER *)&Info_h.biIccProfileSize);
    if (OVar1 == 0) {
      fclose(__stream);
      filename_local = (char *)0x0;
    }
    else {
      OVar1 = bmp_read_info_header((FILE *)__stream,(OPJ_BITMAPINFOHEADER *)&palette_len);
      if (OVar1 == 0) {
        fclose(__stream);
        filename_local = (char *)0x0;
      }
      else {
        if (Info_h.biWidth._2_2_ < 9) {
          memset(lut_G + 0xf8,0,0x100);
          memset(lut_B + 0xf8,0,0x100);
          memset(local_3b8,0,0x100);
          l_result = Info_h.biXpelsPerMeter;
          if ((Info_h.biXpelsPerMeter == 0) && (Info_h.biWidth._2_2_ < 9)) {
            l_result = 1 << ((byte)Info_h.biWidth._2_2_ & 0x1f);
          }
          if (0x100 < (uint)l_result) {
            l_result = 0x100;
          }
          if (l_result != 0) {
            local_495 = 0;
            for (numcmpts = 0; numcmpts < (uint)l_result; numcmpts = numcmpts + 1) {
              iVar2 = getc(__stream);
              local_3b8[numcmpts] = (byte)iVar2;
              iVar2 = getc(__stream);
              lut_B[(ulong)numcmpts + 0xf8] = (OPJ_UINT8)iVar2;
              iVar2 = getc(__stream);
              lut_G[(ulong)numcmpts + 0xf8] = (OPJ_UINT8)iVar2;
              getc(__stream);
              local_495 = local_495 |
                          local_3b8[numcmpts] ^ lut_B[(ulong)numcmpts + 0xf8] |
                          lut_B[(ulong)numcmpts + 0xf8] ^ lut_G[(ulong)numcmpts + 0xf8];
            }
            if (local_495 != 0) {
              local_480 = 3;
            }
          }
        }
        else {
          local_480 = 3;
          if ((Info_h.biHeight == 3) && (Info_h.biGreenMask != 0)) {
            local_480 = 4;
          }
        }
        if ((i == 0) || (Info_h.biSize == 0)) {
          fclose(__stream);
          filename_local = (char *)0x0;
        }
        else if ((uint)(0xffffffe0 / (ulong)i) < (uint)Info_h.biWidth._2_2_) {
          fclose(__stream);
          filename_local = (char *)0x0;
        }
        else {
          local_494 = (i * Info_h.biWidth._2_2_ + 0x1f >> 5) << 2;
          if ((Info_h.biWidth._2_2_ == 4) && (Info_h.biHeight == 2)) {
            if ((uint)(0xffffffe0 / (ulong)i) < 8) {
              fclose(__stream);
              return (opj_image_t *)0x0;
            }
            local_494 = (i * 8 + 0x1f >> 5) << 2;
          }
          if (SUB168((ZEXT816(0) << 0x40 | ZEXT816(0xffffffff)) / ZEXT416(Info_h.biSize),0) <
              (ulong)local_494) {
            fclose(__stream);
            filename_local = (char *)0x0;
          }
          else {
            pData_00 = (OPJ_UINT8 *)calloc(1,(ulong)local_494 * (ulong)Info_h.biSize);
            if (pData_00 == (OPJ_UINT8 *)0x0) {
              fclose(__stream);
              filename_local = (char *)0x0;
            }
            else {
              fseek(__stream,0,0);
              fseek(__stream,(ulong)File_h.bfSize,0);
              switch(Info_h.biHeight) {
              case 0:
              case 3:
                pData._4_4_ = bmp_read_raw_data((FILE *)__stream,pData_00,local_494,i,Info_h.biSize)
                ;
                break;
              case 1:
                pData._4_4_ = bmp_read_rle8_data((FILE *)__stream,pData_00,local_494,i,Info_h.biSize
                                                );
                break;
              case 2:
                pData._4_4_ = bmp_read_rle4_data((FILE *)__stream,pData_00,local_494,i,Info_h.biSize
                                                );
                break;
              default:
                fprintf(_stderr,"Unsupported BMP compression\n");
                pData._4_4_ = 0;
              }
              if (pData._4_4_ == 0) {
                free(pData_00);
                fclose(__stream);
                filename_local = (char *)0x0;
              }
              else {
                memset(lut_R + 0xf8,0,0x90);
                for (numcmpts = 0; numcmpts < 4; numcmpts = numcmpts + 1) {
                  cmptparm[numcmpts].x0 = 8;
                  cmptparm[numcmpts].y0 = 8;
                  cmptparm[numcmpts].prec = 0;
                  cmptparm[(ulong)numcmpts - 1].bpp = parameters->subsampling_dx;
                  cmptparm[(ulong)numcmpts - 1].sgnd = parameters->subsampling_dy;
                  cmptparm[numcmpts].dx = i;
                  cmptparm[numcmpts].dy = Info_h.biSize;
                }
                uVar3 = 1;
                if (local_480 == 1) {
                  uVar3 = 2;
                }
                IN = (FILE *)opj_image_create(local_480,lut_R + 0xf8,uVar3);
                if (IN == (FILE *)0x0) {
                  fclose(__stream);
                  free(pData_00);
                  filename_local = (char *)0x0;
                }
                else {
                  if (local_480 == 4) {
                    ((opj_image_comp_t *)IN->_IO_read_base)[3].alpha = 1;
                  }
                  IN->_flags = parameters->image_offset_x0;
                  *(int *)&IN->field_0x4 = parameters->image_offset_y0;
                  *(OPJ_UINT32 *)&IN->_IO_read_ptr =
                       IN->_flags + (i - 1) * parameters->subsampling_dx + 1;
                  *(OPJ_UINT32 *)((long)&IN->_IO_read_ptr + 4) =
                       *(OPJ_UINT32 *)&IN->field_0x4 +
                       (Info_h.biSize - 1) * parameters->subsampling_dy + 1;
                  if ((Info_h.biWidth._2_2_ == 0x18) && (Info_h.biHeight == 0)) {
                    bmp24toimage(pData_00,local_494,(opj_image_t *)IN);
                  }
                  else if ((Info_h.biWidth._2_2_ == 8) && (Info_h.biHeight == 0)) {
                    bmp8toimage(pData_00,local_494,(opj_image_t *)IN,(OPJ_UINT8 **)&image);
                  }
                  else if ((Info_h.biWidth._2_2_ == 8) && (Info_h.biHeight == 1)) {
                    bmp8toimage(pData_00,local_494,(opj_image_t *)IN,(OPJ_UINT8 **)&image);
                  }
                  else if ((Info_h.biWidth._2_2_ == 4) && (Info_h.biHeight == 2)) {
                    bmp8toimage(pData_00,local_494,(opj_image_t *)IN,(OPJ_UINT8 **)&image);
                  }
                  else if ((Info_h.biWidth._2_2_ == 0x20) && (Info_h.biHeight == 0)) {
                    bmpmask32toimage(pData_00,local_494,(opj_image_t *)IN,0xff0000,0xff00,0xff,0);
                  }
                  else if ((Info_h.biWidth._2_2_ == 0x20) && (Info_h.biHeight == 3)) {
                    if (((Info_h.biClrUsed == 0) && (Info_h.biClrImportant == 0)) &&
                       (Info_h.biRedMask == 0)) {
                      Info_h.biClrUsed = 0xff0000;
                      Info_h.biClrImportant = 0xff00;
                      Info_h.biRedMask = 0xff;
                    }
                    bmpmask32toimage(pData_00,local_494,(opj_image_t *)IN,Info_h.biClrUsed,
                                     Info_h.biClrImportant,Info_h.biRedMask,Info_h.biGreenMask);
                  }
                  else if ((Info_h.biWidth._2_2_ == 0x10) && (Info_h.biHeight == 0)) {
                    bmpmask16toimage(pData_00,local_494,(opj_image_t *)IN,0x7c00,0x3e0,0x1f,0);
                  }
                  else if ((Info_h.biWidth._2_2_ == 0x10) && (Info_h.biHeight == 3)) {
                    if (((Info_h.biClrUsed == 0) && (Info_h.biClrImportant == 0)) &&
                       (Info_h.biRedMask == 0)) {
                      Info_h.biClrUsed = 0xf800;
                      Info_h.biClrImportant = 0x7e0;
                      Info_h.biRedMask = 0x1f;
                    }
                    bmpmask16toimage(pData_00,local_494,(opj_image_t *)IN,Info_h.biClrUsed,
                                     Info_h.biClrImportant,Info_h.biRedMask,Info_h.biGreenMask);
                  }
                  else {
                    opj_image_destroy(IN);
                    IN = (FILE *)0x0;
                    fprintf(_stderr,
                            "Other system than 24 bits/pixels or 8 bits (no RLE coding) is not yet implemented [%d]\n"
                            ,(ulong)Info_h.biWidth._2_2_);
                  }
                  free(pData_00);
                  fclose(__stream);
                  filename_local = (char *)IN;
                }
              }
            }
          }
        }
      }
    }
  }
  return (opj_image_t *)filename_local;
}

Assistant:

opj_image_t* bmptoimage(const char *filename, opj_cparameters_t *parameters)
{
    opj_image_cmptparm_t cmptparm[4];   /* maximum of 4 components */
    OPJ_UINT8 lut_R[256], lut_G[256], lut_B[256];
    OPJ_UINT8 const* pLUT[3];
    opj_image_t * image = NULL;
    FILE *IN;
    OPJ_BITMAPFILEHEADER File_h;
    OPJ_BITMAPINFOHEADER Info_h;
    OPJ_UINT32 i, palette_len, numcmpts = 1U;
    OPJ_BOOL l_result = OPJ_FALSE;
    OPJ_UINT8* pData = NULL;
    OPJ_UINT32 stride;

    pLUT[0] = lut_R;
    pLUT[1] = lut_G;
    pLUT[2] = lut_B;

    IN = fopen(filename, "rb");
    if (!IN) {
        fprintf(stderr, "Failed to open %s for reading !!\n", filename);
        return NULL;
    }

    if (!bmp_read_file_header(IN, &File_h)) {
        fclose(IN);
        return NULL;
    }
    if (!bmp_read_info_header(IN, &Info_h)) {
        fclose(IN);
        return NULL;
    }

    /* Load palette */
    if (Info_h.biBitCount <= 8U) {
        memset(&lut_R[0], 0, sizeof(lut_R));
        memset(&lut_G[0], 0, sizeof(lut_G));
        memset(&lut_B[0], 0, sizeof(lut_B));

        palette_len = Info_h.biClrUsed;
        if ((palette_len == 0U) && (Info_h.biBitCount <= 8U)) {
            palette_len = (1U << Info_h.biBitCount);
        }
        if (palette_len > 256U) {
            palette_len = 256U;
        }
        if (palette_len > 0U) {
            OPJ_UINT8 has_color = 0U;
            for (i = 0U; i < palette_len; i++) {
                lut_B[i] = (OPJ_UINT8)getc(IN);
                lut_G[i] = (OPJ_UINT8)getc(IN);
                lut_R[i] = (OPJ_UINT8)getc(IN);
                (void)getc(IN); /* padding */
                has_color |= (lut_B[i] ^ lut_G[i]) | (lut_G[i] ^ lut_R[i]);
            }
            if (has_color) {
                numcmpts = 3U;
            }
        }
    } else {
        numcmpts = 3U;
        if ((Info_h.biCompression == 3) && (Info_h.biAlphaMask != 0U)) {
            numcmpts++;
        }
    }

    if (Info_h.biWidth == 0 || Info_h.biHeight == 0) {
        fclose(IN);
        return NULL;
    }

    if (Info_h.biBitCount > (((OPJ_UINT32) - 1) - 31) / Info_h.biWidth) {
        fclose(IN);
        return NULL;
    }
    stride = ((Info_h.biWidth * Info_h.biBitCount + 31U) / 32U) *
             4U; /* rows are aligned on 32bits */
    if (Info_h.biBitCount == 4 &&
            Info_h.biCompression == 2) { /* RLE 4 gets decoded as 8 bits data for now... */
        if (8 > (((OPJ_UINT32) - 1) - 31) / Info_h.biWidth) {
            fclose(IN);
            return NULL;
        }
        stride = ((Info_h.biWidth * 8U + 31U) / 32U) * 4U;
    }

    if (stride > ((OPJ_UINT32) - 1) / sizeof(OPJ_UINT8) / Info_h.biHeight) {
        fclose(IN);
        return NULL;
    }
    pData = (OPJ_UINT8 *) calloc(1, sizeof(OPJ_UINT8) * stride * Info_h.biHeight);
    if (pData == NULL) {
        fclose(IN);
        return NULL;
    }
    /* Place the cursor at the beginning of the image information */
    fseek(IN, 0, SEEK_SET);
    fseek(IN, (long)File_h.bfOffBits, SEEK_SET);

    switch (Info_h.biCompression) {
    case 0:
    case 3:
        /* read raw data */
        l_result = bmp_read_raw_data(IN, pData, stride, Info_h.biWidth,
                                     Info_h.biHeight);
        break;
    case 1:
        /* read rle8 data */
        l_result = bmp_read_rle8_data(IN, pData, stride, Info_h.biWidth,
                                      Info_h.biHeight);
        break;
    case 2:
        /* read rle4 data */
        l_result = bmp_read_rle4_data(IN, pData, stride, Info_h.biWidth,
                                      Info_h.biHeight);
        break;
    default:
        fprintf(stderr, "Unsupported BMP compression\n");
        l_result = OPJ_FALSE;
        break;
    }
    if (!l_result) {
        free(pData);
        fclose(IN);
        return NULL;
    }

    /* create the image */
    memset(&cmptparm[0], 0, sizeof(cmptparm));
    for (i = 0; i < 4U; i++) {
        cmptparm[i].prec = 8;
        cmptparm[i].bpp  = 8;
        cmptparm[i].sgnd = 0;
        cmptparm[i].dx   = (OPJ_UINT32)parameters->subsampling_dx;
        cmptparm[i].dy   = (OPJ_UINT32)parameters->subsampling_dy;
        cmptparm[i].w    = Info_h.biWidth;
        cmptparm[i].h    = Info_h.biHeight;
    }

    image = opj_image_create(numcmpts, &cmptparm[0],
                             (numcmpts == 1U) ? OPJ_CLRSPC_GRAY : OPJ_CLRSPC_SRGB);
    if (!image) {
        fclose(IN);
        free(pData);
        return NULL;
    }
    if (numcmpts == 4U) {
        image->comps[3].alpha = 1;
    }

    /* set image offset and reference grid */
    image->x0 = (OPJ_UINT32)parameters->image_offset_x0;
    image->y0 = (OPJ_UINT32)parameters->image_offset_y0;
    image->x1 = image->x0 + (Info_h.biWidth  - 1U) * (OPJ_UINT32)
                parameters->subsampling_dx + 1U;
    image->y1 = image->y0 + (Info_h.biHeight - 1U) * (OPJ_UINT32)
                parameters->subsampling_dy + 1U;

    /* Read the data */
    if (Info_h.biBitCount == 24 && Info_h.biCompression == 0) { /*RGB */
        bmp24toimage(pData, stride, image);
    } else if (Info_h.biBitCount == 8 &&
               Info_h.biCompression == 0) { /* RGB 8bpp Indexed */
        bmp8toimage(pData, stride, image, pLUT);
    } else if (Info_h.biBitCount == 8 && Info_h.biCompression == 1) { /*RLE8*/
        bmp8toimage(pData, stride, image, pLUT);
    } else if (Info_h.biBitCount == 4 && Info_h.biCompression == 2) { /*RLE4*/
        bmp8toimage(pData, stride, image,
                    pLUT); /* RLE 4 gets decoded as 8 bits data for now */
    } else if (Info_h.biBitCount == 32 && Info_h.biCompression == 0) { /* RGBX */
        bmpmask32toimage(pData, stride, image, 0x00FF0000U, 0x0000FF00U, 0x000000FFU,
                         0x00000000U);
    } else if (Info_h.biBitCount == 32 && Info_h.biCompression == 3) { /* bitmask */
        if ((Info_h.biRedMask == 0U) && (Info_h.biGreenMask == 0U) &&
                (Info_h.biBlueMask == 0U)) {
            Info_h.biRedMask   = 0x00FF0000U;
            Info_h.biGreenMask = 0x0000FF00U;
            Info_h.biBlueMask  = 0x000000FFU;
        }
        bmpmask32toimage(pData, stride, image, Info_h.biRedMask, Info_h.biGreenMask,
                         Info_h.biBlueMask, Info_h.biAlphaMask);
    } else if (Info_h.biBitCount == 16 && Info_h.biCompression == 0) { /* RGBX */
        bmpmask16toimage(pData, stride, image, 0x7C00U, 0x03E0U, 0x001FU, 0x0000U);
    } else if (Info_h.biBitCount == 16 && Info_h.biCompression == 3) { /* bitmask */
        if ((Info_h.biRedMask == 0U) && (Info_h.biGreenMask == 0U) &&
                (Info_h.biBlueMask == 0U)) {
            Info_h.biRedMask   = 0xF800U;
            Info_h.biGreenMask = 0x07E0U;
            Info_h.biBlueMask  = 0x001FU;
        }
        bmpmask16toimage(pData, stride, image, Info_h.biRedMask, Info_h.biGreenMask,
                         Info_h.biBlueMask, Info_h.biAlphaMask);
    } else {
        opj_image_destroy(image);
        image = NULL;
        fprintf(stderr,
                "Other system than 24 bits/pixels or 8 bits (no RLE coding) is not yet implemented [%d]\n",
                Info_h.biBitCount);
    }
    free(pData);
    fclose(IN);
    return image;
}